

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

void crc32_init(crc32_t *crc,unsigned_long poly,unsigned_long init,unsigned_long xor)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  crc->poly = poly;
  crc->init = init;
  crc->xor = xor;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    uVar2 = lVar1 << 0x18;
    iVar4 = 8;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      uVar3 = uVar2 >> 0x1f;
      if (uVar2 >> 0x1f != 0) {
        uVar3 = poly;
      }
      uVar2 = uVar3 ^ uVar2 * 2;
    }
    crc->table[lVar1] = uVar2 & 0xffffffff;
  }
  return;
}

Assistant:

void crc32_init(crc32_t *crc, unsigned long poly,
                unsigned long init, unsigned long xor) {
  crc->poly = poly;
  crc->init = init;
  crc->xor = xor;

  int i;
  for (i = 0; i < 256; i++) {
    unsigned long r = (unsigned long)i;
    r <<= 24;

    int j;
    for (j = 0; j < 8; j++) {
      unsigned long bit = r & (1 << 31);
      r <<= 1;
      if (bit)
        r ^= crc->poly;
    }

    r &= 0xFFFFFFFF;
    crc->table[i] = r;
  }
}